

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O0

bool __thiscall
cmTargetPropCommandBase::HandleArguments
          (cmTargetPropCommandBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *prop,ArgumentFlags flags)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  size_type sVar4;
  const_reference pvVar5;
  cmake *this_00;
  cmGlobalGenerator *this_01;
  cmTarget *pcVar6;
  ulong uVar7;
  allocator<char> local_101;
  string local_100;
  byte local_da;
  allocator<char> local_d9;
  undefined1 local_d8 [6];
  bool prepend;
  uint local_b8;
  byte local_b2;
  allocator<char> local_b1;
  uint argIndex;
  bool system;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ArgumentFlags local_2c;
  string *psStack_28;
  ArgumentFlags flags_local;
  string *prop_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmTargetPropCommandBase *this_local;
  
  local_2c = flags;
  psStack_28 = prop;
  prop_local = (string *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"called with incorrect number of arguments",&local_51);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)prop_local,0);
    bVar2 = cmMakefile::IsAlias(pcVar1,pvVar5);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"can not be used on an ALIAS target.",&local_89);
      cmCommand::SetError(&this->super_cmCommand,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
    }
    else {
      this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      this_01 = cmake::GetGlobalGenerator(this_00);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)prop_local,0);
      pcVar6 = cmGlobalGenerator::FindTarget(this_01,pvVar5,false);
      this->Target = pcVar6;
      if (this->Target == (cmTarget *)0x0) {
        pcVar1 = (this->super_cmCommand).Makefile;
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)prop_local,0);
        pcVar6 = cmMakefile::FindTargetToUse(pcVar1,pvVar5,false);
        this->Target = pcVar6;
      }
      if (this->Target == (cmTarget *)0x0) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)prop_local,0);
        (*(this->super_cmCommand)._vptr_cmCommand[8])(this,pvVar5);
      }
      else {
        TVar3 = cmTarget::GetType(this->Target);
        if ((((TVar3 == SHARED_LIBRARY) ||
             (TVar3 = cmTarget::GetType(this->Target), TVar3 == STATIC_LIBRARY)) ||
            (TVar3 = cmTarget::GetType(this->Target), TVar3 == OBJECT_LIBRARY)) ||
           (((TVar3 = cmTarget::GetType(this->Target), TVar3 == MODULE_LIBRARY ||
             (TVar3 = cmTarget::GetType(this->Target), TVar3 == INTERFACE_LIBRARY)) ||
            (TVar3 = cmTarget::GetType(this->Target), TVar3 == EXECUTABLE)))) {
          local_b2 = 0;
          local_b8 = 1;
          if ((local_2c & PROCESS_SYSTEM) != NO_FLAGS) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)prop_local,1);
            bVar2 = std::operator==(pvVar5,"SYSTEM");
            if (bVar2) {
              sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)prop_local);
              if (sVar4 < 3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_d8,"called with incorrect number of arguments",&local_d9)
                ;
                cmCommand::SetError(&this->super_cmCommand,(string *)local_d8);
                std::__cxx11::string::~string((string *)local_d8);
                std::allocator<char>::~allocator(&local_d9);
                return false;
              }
              local_b2 = 1;
              local_b8 = local_b8 + 1;
            }
          }
          local_da = 0;
          if ((local_2c & PROCESS_BEFORE) != NO_FLAGS) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)prop_local,(ulong)local_b8);
            bVar2 = std::operator==(pvVar5,"BEFORE");
            if (bVar2) {
              sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)prop_local);
              if (sVar4 < 3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_100,"called with incorrect number of arguments",
                           &local_101);
                cmCommand::SetError(&this->super_cmCommand,&local_100);
                std::__cxx11::string::~string((string *)&local_100);
                std::allocator<char>::~allocator(&local_101);
                return false;
              }
              local_da = 1;
              local_b8 = local_b8 + 1;
            }
          }
          std::__cxx11::string::operator=((string *)&this->Property,(string *)psStack_28);
          do {
            uVar7 = (ulong)local_b8;
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)prop_local);
            if (sVar4 <= uVar7) {
              return true;
            }
            bVar2 = ProcessContentArgs(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)prop_local,&local_b8,(bool)(local_da & 1),
                                       (bool)(local_b2 & 1));
          } while (bVar2);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&argIndex,"called with non-compilable target type",&local_b1);
          cmCommand::SetError(&this->super_cmCommand,(string *)&argIndex);
          std::__cxx11::string::~string((string *)&argIndex);
          std::allocator<char>::~allocator(&local_b1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool cmTargetPropCommandBase::HandleArguments(
  std::vector<std::string> const& args, const std::string& prop,
  ArgumentFlags flags)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  if (this->Makefile->IsAlias(args[0])) {
    this->SetError("can not be used on an ALIAS target.");
    return false;
  }
  // Lookup the target for which property-values are specified.
  this->Target =
    this->Makefile->GetCMakeInstance()->GetGlobalGenerator()->FindTarget(
      args[0]);
  if (!this->Target) {
    this->Target = this->Makefile->FindTargetToUse(args[0]);
  }
  if (!this->Target) {
    this->HandleMissingTarget(args[0]);
    return false;
  }
  if ((this->Target->GetType() != cmStateEnums::SHARED_LIBRARY) &&
      (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) &&
      (this->Target->GetType() != cmStateEnums::OBJECT_LIBRARY) &&
      (this->Target->GetType() != cmStateEnums::MODULE_LIBRARY) &&
      (this->Target->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
      (this->Target->GetType() != cmStateEnums::EXECUTABLE)) {
    this->SetError("called with non-compilable target type");
    return false;
  }

  bool system = false;
  unsigned int argIndex = 1;

  if ((flags & PROCESS_SYSTEM) && args[argIndex] == "SYSTEM") {
    if (args.size() < 3) {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
    system = true;
    ++argIndex;
  }

  bool prepend = false;
  if ((flags & PROCESS_BEFORE) && args[argIndex] == "BEFORE") {
    if (args.size() < 3) {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
    prepend = true;
    ++argIndex;
  }

  this->Property = prop;

  while (argIndex < args.size()) {
    if (!this->ProcessContentArgs(args, argIndex, prepend, system)) {
      return false;
    }
  }
  return true;
}